

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stats.cpp
# Opt level: O0

RealType __thiscall OpenMD::Stats::getRealError(Stats *this,int index)

{
  reference pvVar1;
  int in_ESI;
  long in_RDI;
  RealType value;
  ResultType *ret;
  undefined4 in_stack_fffffffffffffff0;
  
  ret = (ResultType *)0x0;
  pvVar1 = std::vector<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>::
           operator[]((vector<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_> *
                      )(in_RDI + 0x18),(long)in_ESI);
  if (pvVar1->accumulator != (BaseAccumulator *)0x0) {
    __dynamic_cast(pvVar1->accumulator,&BaseAccumulator::typeinfo,&Accumulator::typeinfo,0);
  }
  Accumulator::get95percentConfidenceInterval
            ((Accumulator *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),ret);
  return (RealType)ret;
}

Assistant:

RealType Stats::getRealError(int index) {
    assert(index >= 0 && index < ENDINDEX);
    RealType value(0.0);
    dynamic_cast<Accumulator*>(data_[index].accumulator)
        ->get95percentConfidenceInterval(value);
    return value;
  }